

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampleMOD.cpp
# Opt level: O3

void __thiscall WDL_Resampler::~WDL_Resampler(WDL_Resampler *this)

{
  WDL_Resampler_Filter *pWVar1;
  
  pWVar1 = this->m_pre_filter;
  if (pWVar1 != (WDL_Resampler_Filter *)0x0) {
    free((pWVar1->m_hist).m_hb.m_buf);
  }
  operator_delete(pWVar1);
  pWVar1 = this->m_post_filter;
  if (pWVar1 != (WDL_Resampler_Filter *)0x0) {
    free((pWVar1->m_hist).m_hb.m_buf);
  }
  operator_delete(pWVar1);
  free((this->m_filter_coeffs).m_hb.m_buf);
  free((this->m_rsinbuf).m_hb.m_buf);
  return;
}

Assistant:

WDL_Resampler::~WDL_Resampler()
{
  delete m_pre_filter;
  delete m_post_filter;
}